

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

char * cmXMLParser::FindAttribute(char **atts,char *attribute)

{
  int iVar1;
  char **a;
  char *pcVar2;
  
  if (attribute == (char *)0x0 || atts == (char **)0x0) {
LAB_0023f274:
    pcVar2 = (char *)0x0;
  }
  else {
    do {
      if ((*atts == (char *)0x0) || (pcVar2 = atts[1], pcVar2 == (char *)0x0)) goto LAB_0023f274;
      iVar1 = strcmp(*atts,attribute);
      atts = atts + 2;
    } while (iVar1 != 0);
  }
  return pcVar2;
}

Assistant:

const char* cmXMLParser::FindAttribute(const char** atts,
                                       const char* attribute)
{
  if (atts && attribute) {
    for (const char** a = atts; *a && *(a + 1); a += 2) {
      if (strcmp(*a, attribute) == 0) {
        return *(a + 1);
      }
    }
  }
  return nullptr;
}